

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

void gimage::imageToColor<float,gimage::PixelTraits<float>>
               (Image<float,_gimage::PixelTraits<float>_> *ret,
               Image<float,_gimage::PixelTraits<float>_> *image)

{
  long lVar1;
  long lVar2;
  float ***pppfVar3;
  float ***pppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  long lVar10;
  
  Image<float,_gimage::PixelTraits<float>_>::setSize(ret,image->width,image->height,3);
  lVar1 = image->height;
  if (0 < lVar1) {
    lVar2 = image->width;
    pppfVar3 = image->img;
    pppfVar4 = ret->img;
    lVar10 = 0;
    do {
      if (0 < lVar2) {
        pfVar5 = (*pppfVar3)[lVar10];
        pfVar6 = (*pppfVar4)[lVar10];
        pfVar7 = pppfVar4[1][lVar10];
        pfVar8 = pppfVar4[2][lVar10];
        lVar9 = 0;
        do {
          pfVar6[lVar9] = pfVar5[lVar9];
          pfVar7[lVar9] = pfVar5[lVar9];
          pfVar8[lVar9] = pfVar5[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar2 != lVar9);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar1);
  }
  return;
}

Assistant:

void imageToColor(Image<T, traits> &ret, const Image<T, traits> &image)
{
  assert(image.getDepth() == 1);

  ret.setSize(image.getWidth(), image.getHeight(), 3);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      ret.set(i, k, 0, image.get(i, k, 0));
      ret.set(i, k, 1, image.get(i, k, 0));
      ret.set(i, k, 2, image.get(i, k, 0));
    }
  }
}